

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::TestFactoryImpl<StringWriter_WriteTwoStrings_Test>::CreateTest
          (TestFactoryImpl<StringWriter_WriteTwoStrings_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x48);
  Test::Test(this_00);
  this_00[1]._vptr_Test = (_func_int **)0x0;
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  this_00[2]._vptr_Test = (_func_int **)0x0;
  this_00[3]._vptr_Test = (_func_int **)(this_00 + 1);
  this_00[3].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined1 *)&this_00[4]._vptr_Test = 0;
  this_00[2].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__vector_writer_0019ac90;
  this_00->_vptr_Test = (_func_int **)&PTR__StringWriter_00196f98;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }